

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder_internal.h
# Opt level: O3

int __thiscall basist::approx_move_to_front::init(approx_move_to_front *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  void *pvVar2;
  uint32_t new_size;
  uint min_new_capacity;
  
  min_new_capacity = (uint)ctx;
  uVar1 = (this->m_values).m_size;
  if (uVar1 != min_new_capacity) {
    if (uVar1 <= min_new_capacity) {
      if ((this->m_values).m_capacity < min_new_capacity) {
        basisu::elemental_vector::increase_capacity
                  ((elemental_vector *)this,min_new_capacity,uVar1 + 1 == min_new_capacity,4,
                   (object_mover)0x0,false);
        uVar1 = (this->m_values).m_size;
      }
      pvVar2 = memset((this->m_values).m_p + uVar1,0,(ulong)(min_new_capacity - uVar1) << 2);
      uVar1 = (uint)pvVar2;
    }
    (this->m_values).m_size = min_new_capacity;
  }
  this->m_rover = min_new_capacity >> 1;
  return uVar1;
}

Assistant:

void init(uint32_t n)
		{
			m_values.resize(n);
			m_rover = n / 2;
		}